

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_lua.c
# Opt level: O0

int l_sqlite3_create_function(lua_State *L)

{
  sqlite3 *db_00;
  int iVar1;
  DB *db_01;
  CB_Data *p;
  char *zFunc;
  double dVar2;
  _func_void_sqlite3_context_ptr *local_38;
  _func_void_sqlite3_context_ptr *xfinal;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xstep;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xfunc;
  CB_Data *cb_data;
  DB *db;
  lua_State *L_local;
  
  db_01 = (DB *)checkudata(L,1);
  p = get_named_cb_data(L,db_01,(void *)((long)&db_01->sqlite3 + 2),2);
  iVar1 = checknilornoneorfunc(L,4);
  if (iVar1 == 0) {
    xstep = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
  }
  else {
    xstep = xfunc_callback_wrapper;
  }
  iVar1 = checknilornoneorfunc(L,5);
  if (iVar1 == 0) {
    xfinal = (_func_void_sqlite3_context_ptr *)0x0;
  }
  else {
    xfinal = xstep_callback_wrapper;
  }
  iVar1 = checknilornoneorfunc(L,6);
  if (iVar1 == 0) {
    local_38 = (_func_void_sqlite3_context_ptr *)0x0;
  }
  else {
    local_38 = xfinal_callback_wrapper;
  }
  register_callback(L,db_01,(void *)((long)&p->db + 1),4);
  register_callback(L,db_01,(void *)((long)&p->db + 2),5);
  register_callback(L,db_01,(void *)((long)&p->db + 3),6);
  db_00 = db_01->sqlite3;
  zFunc = (char *)luaL_checklstring(L,2,0);
  dVar2 = (double)luaL_checknumber(L,3);
  iVar1 = sqlite3_create_function
                    (db_00,zFunc,(int)dVar2,1,p,xstep,
                     (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)xfinal,local_38);
  lua_pushnumber((double)iVar1,L);
  return 1;
}

Assistant:

FUNC( l_sqlite3_create_function )
{
  DB * db		= checkdb(L, 1);
  CB_Data * cb_data	= get_function_cb_data(L, db, 2);
  
  void (*xfunc)(sqlite3_context *, int, sqlite3_value **) = 0;
  void (*xstep)(sqlite3_context *, int, sqlite3_value **) = 0;
  void (*xfinal)(sqlite3_context *) = 0;
  
  if ( checknilornoneorfunc(L, 4) )
    xfunc = xfunc_callback_wrapper;
  else
    xfunc = 0;
  
  if ( checknilornoneorfunc(L, 5) )
    xstep = xstep_callback_wrapper;
  else
    xstep = 0;
  
  if ( checknilornoneorfunc(L, 6) )
    xfinal = xfinal_callback_wrapper;
  else
    xfinal = 0;
  
  register_callback(L, db, KEY_XFUNC(cb_data), 4);
  register_callback(L, db, KEY_XSTEP(cb_data), 5);
  register_callback(L, db, KEY_XFINAL(cb_data), 6);
  
  lua_pushnumber(L,
    sqlite3_create_function (
      db->sqlite3,
      checkstr(L, 2),
      checkint(L, 3),
      SQLITE_UTF8,
      cb_data,
      xfunc,
      xstep,
      xfinal ));
  
  return 1;
}